

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::perspective_display::on_wheel_down(perspective_display *this,unsigned_long param_1)

{
  rectangle *this_00;
  double camera_field_of_view_;
  bool bVar1;
  unsigned_long num_pixels_;
  unsigned_long uVar2;
  vector<double,_3L> local_138;
  vector<double,_3L> local_118;
  vector<double,_3L> local_f8;
  camera_transform local_e0;
  
  this_00 = &(this->super_drawable).rect;
  bVar1 = rectangle::contains(this_00,*(this->super_drawable).lastx,*(this->super_drawable).lasty);
  if (((bVar1) && ((this->super_drawable).hidden == false)) &&
     ((this->super_drawable).enabled == true)) {
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (local_138.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[2] -
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2]) * 0.1 +
         local_138.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (local_138.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[0] -
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0]) * 0.1 +
         local_138.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (local_138.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[1] -
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1]) * 0.1 +
         local_138.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    camera_field_of_view_ = (this->tform).camera_field_of_view;
    num_pixels_ = rectangle::width(this_00);
    uVar2 = rectangle::height(this_00);
    if (uVar2 < num_pixels_) {
      num_pixels_ = uVar2;
    }
    camera_transform::camera_transform
              (&local_e0,&local_138,&local_f8,&local_118,camera_field_of_view_,num_pixels_);
    camera_transform::operator=(&this->tform,&local_e0);
    base_window::invalidate_rectangle(&((this->super_drawable).parent)->super_base_window,this_00);
  }
  return;
}

Assistant:

void perspective_display::
    on_wheel_down (
        unsigned long //state
    )
    {
        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;

        const double alpha = 0.10;
        const vector<double> delta = alpha*(tform.get_camera_pos() - tform.get_camera_looking_at());
        tform = camera_transform(
            tform.get_camera_pos() + delta,
            tform.get_camera_looking_at(),
            tform.get_camera_up_direction(),
            tform.get_camera_field_of_view(),
            std::min(rect.width(),rect.height()));
        parent.invalidate_rectangle(rect);
    }